

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumDescriptor::CopyTo(EnumDescriptor *this,EnumDescriptorProto *proto)

{
  string_view value;
  int iVar1;
  EnumDescriptorProto *pEVar2;
  int iVar3;
  SymbolVisibility SVar4;
  uint32_t *puVar5;
  Arena *arena;
  EnumValueDescriptor *this_00;
  EnumValueDescriptorProto *proto_00;
  EnumDescriptorProto_EnumReservedRange *pEVar6;
  ReservedRange *pRVar7;
  EnumOptions *pEVar8;
  EnumOptions *pEVar9;
  string_view local_78;
  int local_64;
  EnumDescriptorProto_EnumReservedRange *pEStack_60;
  int i_2;
  EnumReservedRange *range;
  int i_1;
  int i;
  EnumDescriptorProto *local_40;
  EnumDescriptorProto *proto_local;
  EnumDescriptor *this_local;
  char *local_28;
  int *local_20;
  EnumDescriptorProto *local_18;
  anon_union_104_1_493b367e_for_EnumDescriptorProto_3 *local_10;
  
  local_40 = proto;
  proto_local = (EnumDescriptorProto *)this;
  _i_1 = name(this);
  local_20 = &i_1;
  local_10 = &proto->field_0;
  local_18 = proto;
  puVar5 = internal::HasBits<1>::operator[](&(proto->field_0)._impl_._has_bits_,0);
  *puVar5 = *puVar5 | 1;
  this_local = *(EnumDescriptor **)local_20;
  local_28 = *(char **)(local_20 + 2);
  arena = MessageLite::GetArena((MessageLite *)proto);
  value._M_str = local_28;
  value._M_len = (size_t)this_local;
  internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.name_,value,arena);
  range._4_4_ = 0;
  while( true ) {
    iVar1 = range._4_4_;
    iVar3 = value_count(this);
    if (iVar3 <= iVar1) break;
    this_00 = EnumDescriptor::value(this,range._4_4_);
    proto_00 = EnumDescriptorProto::add_value(local_40);
    EnumValueDescriptor::CopyTo(this_00,proto_00);
    range._4_4_ = range._4_4_ + 1;
  }
  range._0_4_ = 0;
  while( true ) {
    iVar1 = (int)range;
    iVar3 = reserved_range_count(this);
    if (iVar3 <= iVar1) break;
    pEVar6 = EnumDescriptorProto::add_reserved_range(local_40);
    pEStack_60 = pEVar6;
    pRVar7 = reserved_range(this,(int)range);
    EnumDescriptorProto_EnumReservedRange::set_start(pEVar6,pRVar7->start);
    pEVar6 = pEStack_60;
    pRVar7 = reserved_range(this,(int)range);
    EnumDescriptorProto_EnumReservedRange::set_end(pEVar6,pRVar7->end);
    range._0_4_ = (int)range + 1;
  }
  local_64 = 0;
  while( true ) {
    iVar1 = local_64;
    iVar3 = reserved_name_count(this);
    pEVar2 = local_40;
    if (iVar3 <= iVar1) break;
    local_78 = reserved_name(this,local_64);
    EnumDescriptorProto::add_reserved_name<std::basic_string_view<char,std::char_traits<char>>>
              (pEVar2,&local_78);
    local_64 = local_64 + 1;
  }
  SVar4 = visibility_keyword(this);
  pEVar2 = local_40;
  if (SVar4 != VISIBILITY_UNSET) {
    SVar4 = visibility_keyword(this);
    EnumDescriptorProto::set_visibility(pEVar2,SVar4);
  }
  pEVar8 = options(this);
  pEVar9 = EnumOptions::default_instance();
  if (pEVar8 != pEVar9) {
    pEVar8 = options(this);
    pEVar9 = EnumDescriptorProto::mutable_options(local_40);
    EnumOptions::operator=(pEVar9,pEVar8);
  }
  anon_unknown_24::RestoreFeaturesToOptions<google::protobuf::EnumDescriptorProto>
            (this->proto_features_,local_40);
  return;
}

Assistant:

void EnumDescriptor::CopyTo(EnumDescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < value_count(); i++) {
    value(i)->CopyTo(proto->add_value());
  }
  for (int i = 0; i < reserved_range_count(); i++) {
    EnumDescriptorProto::EnumReservedRange* range = proto->add_reserved_range();
    range->set_start(reserved_range(i)->start);
    range->set_end(reserved_range(i)->end);
  }
  for (int i = 0; i < reserved_name_count(); i++) {
    proto->add_reserved_name(reserved_name(i));
  }

  if (visibility_keyword() != SymbolVisibility::VISIBILITY_UNSET) {
    proto->set_visibility(visibility_keyword());
  }

  if (&options() != &EnumOptions::default_instance()) {
    *proto->mutable_options() = options();
  }
  RestoreFeaturesToOptions(proto_features_, proto);
}